

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_16549e0::HighBDConvolveScaleTest_DISABLED_Speed_Test::TestBody
          (HighBDConvolveScaleTest_DISABLED_Speed_Test *this)

{
  ConvolveScaleTestBase<unsigned_short> *in_stack_000000d0;
  
  ConvolveScaleTestBase<unsigned_short>::SpeedTest(in_stack_000000d0);
  return;
}

Assistant:

TEST_P(HighBDConvolveScaleTest, DISABLED_Speed) { SpeedTest(); }